

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExtWrenchesAndJointTorquesEstimator.cpp
# Opt level: O3

bool __thiscall
iDynTree::ExtWrenchesAndJointTorquesEstimator::setModel
          (ExtWrenchesAndJointTorquesEstimator *this,Model *_model)

{
  char cVar1;
  SensorsList *_sensors;
  size_t nrOfLinks;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ftJointNames;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_48;
  
  iDynTree::Model::operator=(&this->m_model,_model);
  iDynTree::Model::computeFullTreeTraversal((Traversal *)this);
  iDynTree::LinkTraversalsCache::resize((Model *)&this->m_kinematicTraversals);
  iDynTree::JointPosDoubleArray::resize((Model *)&this->m_jointPos);
  iDynTree::JointDOFsDoubleArray::resize((Model *)&this->m_jointVel);
  iDynTree::JointDOFsDoubleArray::resize((Model *)&this->m_jointAcc);
  iDynTree::LinkVelArray::resize((Model *)&this->m_linkVels);
  iDynTree::LinkAccArray::resize((Model *)&this->m_linkProperAccs);
  iDynTree::LinkWrenches::resize((Model *)&this->m_linkIntWrenches);
  iDynTree::LinkWrenches::resize((Model *)&this->m_linkNetExternalWrenches);
  iDynTree::FreeFloatingGeneralizedTorques::resize((Model *)&this->m_generalizedTorques);
  local_48.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_48.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_48.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  _sensors = (SensorsList *)iDynTree::Model::sensors();
  getFTJointNames(_sensors,&local_48);
  cVar1 = iDynTree::SubModelDecomposition::splitModelAlongJoints
                    ((Model *)&this->m_submodels,(Traversal *)this,
                     (vector *)&this->m_dynamicTraversal);
  if (cVar1 == '\0') {
    iDynTree::reportError
              ("ExtWrenchesAndJointTorquesEstimator","setModelAndSensors",
               "Error in creating submodel decomposition of the model.");
  }
  else {
    estimateExternalWrenchesBuffers::resize(&this->m_bufs,&this->m_submodels);
    nrOfLinks = iDynTree::Model::getNrOfLinks();
    estimateExternalWrenchesBuffers::resize(&this->m_calibBufs,1,nrOfLinks);
    this->m_isModelValid = true;
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_48);
  return (bool)cVar1;
}

Assistant:

bool ExtWrenchesAndJointTorquesEstimator::setModel(const Model& _model)
{
    m_model = _model;

    // resize the data structures
    m_model.computeFullTreeTraversal(m_dynamicTraversal);
    m_kinematicTraversals.resize(m_model);

    m_jointPos.resize(m_model);
    m_jointVel.resize(m_model);
    m_jointAcc.resize(m_model);
    m_linkVels.resize(m_model);
    m_linkProperAccs.resize(m_model);
    m_linkIntWrenches.resize(m_model);
    m_linkNetExternalWrenches.resize(m_model);
    m_generalizedTorques.resize(m_model);

    // create submodel structure
    std::vector<std::string> ftJointNames;
    getFTJointNames(m_model.sensors(),ftJointNames);
    bool ok = m_submodels.splitModelAlongJoints(m_model,m_dynamicTraversal,ftJointNames);

    if( !ok )
    {
        reportError("ExtWrenchesAndJointTorquesEstimator","setModelAndSensors","Error in creating submodel decomposition of the model.");
        return false;
    }

    m_bufs.resize(m_submodels);
    m_calibBufs.resize(1,_model.getNrOfLinks());

    // set that the model is valid
    m_isModelValid = true;

    return true;
}